

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

pString string_from_array(char *str,size_t len)

{
  pString res;
  size_t len_local;
  char *str_local;
  
  str_local = (char *)string_allocate_memory(len);
  if ((pString)str_local == (pString)0x0) {
    printf("string_from_array: string_allocate_memory failed\n");
    str_local = (char *)0x0;
  }
  else {
    string_copy_chars(((pString)str_local)->buf,str,len);
  }
  return (pString)str_local;
}

Assistant:

pString string_from_array(char *str, size_t len)
{
    pString res = string_allocate_memory(len);
    if (res == NULL)
    {
        log("string_from_array: string_allocate_memory failed");
        return NULL;
    }
    string_copy_chars(res->buf, str, len);
    return res;
}